

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  short sVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  short sVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar15 = (ulong)uVar14;
  uVar7 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar7 == 0xff) {
    lVar19 = 0;
    do {
      lVar18 = lVar19;
      lVar19 = lVar18 + 1;
    } while (hdc->maxcode[lVar18 + 10] <= uVar14 >> 0x10);
    uVar10 = j->code_bits;
    if (lVar19 != 8) {
      pcVar13 = "bad huffman code";
      if (((int)uVar10 < (int)(lVar18 + 10)) ||
         (uVar11 = (uVar14 >> (0x17U - (char)lVar19 & 0x1f) & stbi__bmask[lVar18 + 10]) +
                   hdc->delta[lVar18 + 10], 0xff < uVar11)) goto LAB_001378dc;
      uVar10 = (uVar10 - (int)lVar19) - 9;
      uVar14 = uVar14 << ((byte)(lVar18 + 10) & 0x1f);
      j->code_bits = uVar10;
      j->code_buffer = uVar14;
      uVar7 = (ulong)uVar11;
      goto LAB_001377d8;
    }
LAB_001378cc:
    uVar10 = uVar10 - 0x10;
    j->code_bits = uVar10;
  }
  else {
    bVar1 = hdc->size[uVar7];
    uVar10 = j->code_bits - (uint)bVar1;
    if ((int)(uint)bVar1 <= j->code_bits) {
      uVar14 = uVar14 << (bVar1 & 0x1f);
      j->code_buffer = uVar14;
      j->code_bits = uVar10;
LAB_001377d8:
      uVar15 = (ulong)uVar14;
      bVar1 = hdc->values[uVar7];
      pcVar13 = "bad huffman code";
      if (bVar1 < 0x10) {
        data[0x38] = 0;
        data[0x39] = 0;
        data[0x3a] = 0;
        data[0x3b] = 0;
        data[0x3c] = 0;
        data[0x3d] = 0;
        data[0x3e] = 0;
        data[0x3f] = 0;
        data[0x30] = 0;
        data[0x31] = 0;
        data[0x32] = 0;
        data[0x33] = 0;
        data[0x34] = 0;
        data[0x35] = 0;
        data[0x36] = 0;
        data[0x37] = 0;
        data[0x28] = 0;
        data[0x29] = 0;
        data[0x2a] = 0;
        data[0x2b] = 0;
        data[0x2c] = 0;
        data[0x2d] = 0;
        data[0x2e] = 0;
        data[0x2f] = 0;
        data[0x20] = 0;
        data[0x21] = 0;
        data[0x22] = 0;
        data[0x23] = 0;
        data[0x24] = 0;
        data[0x25] = 0;
        data[0x26] = 0;
        data[0x27] = 0;
        data[0x18] = 0;
        data[0x19] = 0;
        data[0x1a] = 0;
        data[0x1b] = 0;
        data[0x1c] = 0;
        data[0x1d] = 0;
        data[0x1e] = 0;
        data[0x1f] = 0;
        data[0x10] = 0;
        data[0x11] = 0;
        data[0x12] = 0;
        data[0x13] = 0;
        data[0x14] = 0;
        data[0x15] = 0;
        data[0x16] = 0;
        data[0x17] = 0;
        data[8] = 0;
        data[9] = 0;
        data[10] = 0;
        data[0xb] = 0;
        data[0xc] = 0;
        data[0xd] = 0;
        data[0xe] = 0;
        data[0xf] = 0;
        data[0] = 0;
        data[1] = 0;
        data[2] = 0;
        data[3] = 0;
        data[4] = 0;
        data[5] = 0;
        data[6] = 0;
        data[7] = 0;
        uVar14 = 0;
        if (bVar1 != 0) {
          iVar12 = j->code_bits;
          if (iVar12 < (int)(uint)bVar1) {
            stbi__grow_buffer_unsafe(j);
            iVar12 = j->code_bits;
          }
          uVar14 = 0;
          if ((int)(uint)bVar1 <= iVar12) {
            uVar14 = j->code_buffer;
            uVar11 = uVar14 << (bVar1 & 0x1f) | uVar14 >> 0x20 - (bVar1 & 0x1f);
            uVar10 = stbi__bmask[bVar1];
            j->code_buffer = ~uVar10 & uVar11;
            j->code_bits = iVar12 - (uint)bVar1;
            iVar12 = 0;
            if (-1 < (int)uVar14) {
              iVar12 = stbi__jbias[bVar1];
            }
            uVar14 = iVar12 + (uVar11 & uVar10);
          }
        }
        uVar11 = j->img_comp[b].dc_pred;
        if (-1 < (int)(uVar11 ^ uVar14)) {
          bVar4 = (int)uVar11 < (int)(-0x80000000 - uVar14);
          uVar15 = (ulong)bVar4;
          uVar10 = uVar14 ^ 0x7fffffff;
          bVar5 = (int)uVar10 < (int)uVar11;
          if ((int)(uVar11 & uVar14) < 0) {
            bVar5 = bVar4;
          }
          if (bVar5) {
            pcVar13 = "bad delta";
            goto LAB_001378dc;
          }
        }
        uVar11 = uVar11 + uVar14;
        j->img_comp[b].dc_pred = uVar11;
        uVar2 = *dequant;
        uVar15 = (ulong)uVar2;
        if (uVar2 == 0) {
LAB_001379fe:
          *data = uVar2 * (short)uVar11;
          uVar10 = j->code_bits;
          iVar12 = 1;
          do {
            if ((int)uVar10 < 0x10) {
              stbi__grow_buffer_unsafe(j);
            }
            uVar14 = j->code_buffer;
            uVar15 = (ulong)uVar14;
            uVar7 = (ulong)(uVar14 >> 0x17);
            uVar2 = fac[uVar7];
            if (uVar2 == 0) {
              if (j->code_bits < 0x10) {
                stbi__grow_buffer_unsafe(j);
                uVar15 = (ulong)j->code_buffer;
                uVar7 = (ulong)(j->code_buffer >> 0x17);
              }
              uVar7 = (ulong)hac->fast[uVar7];
              uVar14 = (uint)uVar15;
              if (uVar7 == 0xff) {
                lVar19 = 0;
                do {
                  lVar18 = lVar19;
                  lVar19 = lVar18 + 1;
                } while (hac->maxcode[lVar18 + 10] <= (uint)(uVar15 >> 0x10));
                uVar10 = j->code_bits;
                if (lVar19 == 8) goto LAB_001378cc;
                if (((int)uVar10 < (int)(lVar18 + 10)) ||
                   (uVar11 = (uVar14 >> (0x17U - (char)lVar19 & 0x1f) & stbi__bmask[lVar18 + 10]) +
                             hac->delta[lVar18 + 10], 0xff < uVar11)) goto LAB_001378d5;
                iVar20 = uVar10 - (int)lVar19;
                uVar10 = (uVar10 - (int)lVar19) - 9;
                j->code_bits = iVar20 + -9;
                j->code_buffer = uVar14 << ((byte)(lVar18 + 10) & 0x1f);
                uVar7 = (ulong)uVar11;
              }
              else {
                bVar1 = hac->size[uVar7];
                uVar10 = j->code_bits - (uint)bVar1;
                if (j->code_bits < (int)(uint)bVar1) goto LAB_001378d5;
                j->code_buffer = uVar14 << (bVar1 & 0x1f);
                j->code_bits = uVar10;
              }
              bVar1 = hac->values[uVar7];
              uVar14 = bVar1 & 0xf;
              if ((bVar1 & 0xf) == 0) {
                if (bVar1 != 0xf0) {
                  return 1;
                }
                iVar12 = iVar12 + 0x10;
              }
              else {
                lVar19 = (long)iVar12 + (ulong)(bVar1 >> 4);
                bVar1 = ""[lVar19];
                if ((int)uVar10 < (int)uVar14) {
                  stbi__grow_buffer_unsafe(j);
                  uVar10 = j->code_bits;
                }
                sVar6 = 0;
                sVar16 = 0;
                if ((int)uVar14 <= (int)uVar10) {
                  uVar11 = j->code_buffer;
                  uVar17 = uVar11 << (sbyte)uVar14 | uVar11 >> 0x20 - (sbyte)uVar14;
                  uVar3 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 << 2));
                  j->code_buffer = ~uVar3 & uVar17;
                  j->code_bits = uVar10 - uVar14;
                  if (-1 < (int)uVar11) {
                    sVar6 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 << 2));
                  }
                  sVar16 = ((ushort)uVar17 & (ushort)uVar3) + sVar6;
                  uVar10 = uVar10 - uVar14;
                }
                iVar12 = (int)lVar19 + 1;
                *(short *)((long)data + (ulong)((uint)bVar1 * 2)) =
                     sVar16 * *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
              }
            }
            else {
              uVar11 = uVar2 & 0xf;
              uVar10 = j->code_bits - uVar11;
              if (j->code_bits < (int)uVar11) goto LAB_001378d5;
              lVar19 = (long)iVar12 + (ulong)(uVar2 >> 4 & 0xf);
              j->code_buffer = uVar14 << (sbyte)uVar11;
              j->code_bits = uVar10;
              iVar12 = (int)lVar19 + 1;
              *(short *)((long)data + (ulong)((uint)""[lVar19] * 2)) =
                   (short)(char)(uVar2 >> 8) *
                   *(short *)((long)dequant + (ulong)((uint)""[lVar19] * 2));
            }
            if (0x3f < iVar12) {
              return 1;
            }
          } while( true );
        }
        if ((int)uVar11 < 0) {
          uVar14 = 0x8000 / uVar2;
          uVar9 = (ushort)(0x8000 % (uint)uVar2);
          if (SBORROW4(uVar11,-uVar14) == (int)(uVar11 + uVar14) < 0) goto LAB_001379fe;
        }
        else {
          uVar9 = (ushort)(0x7fff % (uint)uVar2);
          if (uVar11 <= 0x7fff / uVar2) goto LAB_001379fe;
        }
        uVar10 = (uint)uVar9;
        pcVar13 = "can\'t merge dc and ac";
      }
      goto LAB_001378dc;
    }
  }
LAB_001378d5:
  pcVar13 = "bad huffman code";
LAB_001378dc:
  puVar8 = (undefined8 *)__tls_get_addr(&PTR_00162d50,uVar15,uVar10);
  *puVar8 = pcVar13;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta","Corrupt JPEG");
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   if (!stbi__mul2shorts_valid(dc, dequant[0])) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}